

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytecodeCompiler.c
# Opt level: O0

sysbvm_tuple_t
sysbvm_functionBytecodeDirectCompiler_getBindingValue
          (sysbvm_context_t *context,sysbvm_functionBytecodeDirectCompiler_t *compiler,
          sysbvm_tuple_t binding)

{
  sysbvm_functionBytecodeAssembler_t *psVar1;
  sysbvm_symbolBinding_t *result;
  sysbvm_functionBytecodeDirectCompiler_t *psVar2;
  _Bool _Var3;
  sysbvm_tuple_t sVar4;
  sysbvm_tuple_t sVar5;
  sysbvm_functionBytecodeDirectCompiler_t *compilerObject;
  sysbvm_tuple_t value;
  sysbvm_tuple_t bindingLiteral;
  sysbvm_tuple_t valueTemp;
  sysbvm_symbolBinding_t *tupleBindingObject;
  sysbvm_tuple_t reference;
  sysbvm_tuple_t tupleValue;
  sysbvm_symbolTupleSlotBinding_t *bindingObject;
  sysbvm_tuple_t binding_local;
  sysbvm_functionBytecodeDirectCompiler_t *compiler_local;
  sysbvm_context_t *context_local;
  
  bindingObject = (sysbvm_symbolTupleSlotBinding_t *)binding;
  binding_local = (sysbvm_tuple_t)compiler;
  compiler_local = (sysbvm_functionBytecodeDirectCompiler_t *)context;
  _Var3 = sysbvm_tuple_isKindOf(context,binding,(context->roots).symbolTupleSlotBindingType);
  if (_Var3) {
    tupleValue = (sysbvm_tuple_t)bindingObject;
    reference = sysbvm_functionBytecodeDirectCompiler_getBindingValue
                          ((sysbvm_context_t *)compiler_local,
                           (sysbvm_functionBytecodeDirectCompiler_t *)binding_local,
                           bindingObject->tupleBinding);
    psVar2 = compiler_local;
    psVar1 = *(sysbvm_functionBytecodeAssembler_t **)(binding_local + 0x10);
    sVar5 = sysbvm_typeSlot_getValidReferenceType
                      ((sysbvm_context_t *)compiler_local,*(sysbvm_tuple_t *)(tupleValue + 0x50));
    tupleBindingObject =
         (sysbvm_symbolBinding_t *)
         sysbvm_functionBytecodeAssembler_newTemporary((sysbvm_context_t *)psVar2,psVar1,sVar5);
    valueTemp = *(sysbvm_tuple_t *)(tupleValue + 0x48);
    _Var3 = sysbvm_type_isPointerLikeType(*(sysbvm_tuple_t *)(valueTemp + 0x30));
    psVar2 = compiler_local;
    sVar5 = reference;
    result = tupleBindingObject;
    if (_Var3) {
      psVar1 = *(sysbvm_functionBytecodeAssembler_t **)(binding_local + 0x10);
      sVar4 = sysbvm_functionBytecodeAssembler_addLiteral
                        ((sysbvm_context_t *)compiler_local,
                         *(sysbvm_functionBytecodeAssembler_t **)(binding_local + 0x10),
                         *(sysbvm_tuple_t *)(tupleValue + 0x50));
      sysbvm_functionBytecodeAssembler_refSlotReferenceAt
                ((sysbvm_context_t *)psVar2,psVar1,(sysbvm_tuple_t)result,sVar5,sVar4);
    }
    else {
      psVar1 = *(sysbvm_functionBytecodeAssembler_t **)(binding_local + 0x10);
      sVar4 = sysbvm_functionBytecodeAssembler_addLiteral
                        ((sysbvm_context_t *)compiler_local,
                         *(sysbvm_functionBytecodeAssembler_t **)(binding_local + 0x10),
                         *(sysbvm_tuple_t *)(tupleValue + 0x50));
      sysbvm_functionBytecodeAssembler_slotReferenceAt
                ((sysbvm_context_t *)psVar2,psVar1,(sysbvm_tuple_t)result,sVar5,sVar4);
    }
    context_local = (sysbvm_context_t *)tupleBindingObject;
  }
  else {
    _Var3 = sysbvm_symbolBinding_isValue
                      ((sysbvm_context_t *)compiler_local,(sysbvm_tuple_t)bindingObject);
    psVar2 = compiler_local;
    if (_Var3) {
      psVar1 = *(sysbvm_functionBytecodeAssembler_t **)(binding_local + 0x10);
      sVar5 = sysbvm_symbolBinding_getType((sysbvm_tuple_t)bindingObject);
      bindingLiteral =
           sysbvm_functionBytecodeAssembler_newTemporary((sysbvm_context_t *)psVar2,psVar1,sVar5);
      value = sysbvm_functionBytecodeAssembler_addLiteral
                        ((sysbvm_context_t *)compiler_local,
                         *(sysbvm_functionBytecodeAssembler_t **)(binding_local + 0x10),
                         (sysbvm_tuple_t)bindingObject);
      sysbvm_functionBytecodeAssembler_loadSymbolValueBinding
                ((sysbvm_context_t *)compiler_local,
                 *(sysbvm_functionBytecodeAssembler_t **)(binding_local + 0x10),bindingLiteral,value
                );
      context_local = (sysbvm_context_t *)bindingLiteral;
    }
    else {
      compilerObject = (sysbvm_functionBytecodeDirectCompiler_t *)0x0;
      _Var3 = sysbvm_methodDictionary_find
                        (*(sysbvm_tuple_t *)(binding_local + 0x18),(sysbvm_tuple_t)bindingObject,
                         (sysbvm_tuple_t *)&compilerObject);
      if (!_Var3) {
        sysbvm_error("Invalid value binding.");
      }
      context_local = (sysbvm_context_t *)compilerObject;
    }
  }
  return (sysbvm_tuple_t)context_local;
}

Assistant:

SYSBVM_API sysbvm_tuple_t sysbvm_functionBytecodeDirectCompiler_getBindingValue(sysbvm_context_t *context, sysbvm_functionBytecodeDirectCompiler_t *compiler, sysbvm_tuple_t binding)
{
    (void)context;
    if(sysbvm_tuple_isKindOf(context, binding, context->roots.symbolTupleSlotBindingType))
    {
        sysbvm_symbolTupleSlotBinding_t *bindingObject = (sysbvm_symbolTupleSlotBinding_t*)binding;
        sysbvm_tuple_t tupleValue = sysbvm_functionBytecodeDirectCompiler_getBindingValue(context, compiler, bindingObject->tupleBinding);
        sysbvm_tuple_t reference = sysbvm_functionBytecodeAssembler_newTemporary(context, compiler->assembler, sysbvm_typeSlot_getValidReferenceType(context, bindingObject->typeSlot));

        sysbvm_symbolBinding_t *tupleBindingObject = (sysbvm_symbolBinding_t*)bindingObject->tupleBinding;

        if(sysbvm_type_isPointerLikeType(tupleBindingObject->type))
            sysbvm_functionBytecodeAssembler_refSlotReferenceAt(context, compiler->assembler, reference, tupleValue, sysbvm_functionBytecodeAssembler_addLiteral(context, compiler->assembler, bindingObject->typeSlot));
        else
            sysbvm_functionBytecodeAssembler_slotReferenceAt(context, compiler->assembler, reference, tupleValue, sysbvm_functionBytecodeAssembler_addLiteral(context, compiler->assembler, bindingObject->typeSlot));
        return reference;
    }

    if(sysbvm_symbolBinding_isValue(context, binding))
    {
        sysbvm_tuple_t valueTemp = sysbvm_functionBytecodeAssembler_newTemporary(context, compiler->assembler, sysbvm_symbolBinding_getType(binding));
        sysbvm_tuple_t bindingLiteral = sysbvm_functionBytecodeAssembler_addLiteral(context, compiler->assembler, binding);
        sysbvm_functionBytecodeAssembler_loadSymbolValueBinding(context, compiler->assembler, valueTemp, bindingLiteral);
        return valueTemp;
    }

    sysbvm_tuple_t value = SYSBVM_NULL_TUPLE;
    sysbvm_functionBytecodeDirectCompiler_t *compilerObject = (sysbvm_functionBytecodeDirectCompiler_t*)compiler;
    if(!sysbvm_methodDictionary_find(compilerObject->bindingDictionary, binding, &value))
        sysbvm_error("Invalid value binding.");

    return value;
}